

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O3

FileDescriptorProto * __thiscall
google::protobuf::SimpleDescriptorDatabase::
DescriptorIndex<const_google::protobuf::FileDescriptorProto_*>::FindSymbol
          (DescriptorIndex<const_google::protobuf::FileDescriptorProto_*> *this,string *name)

{
  bool bVar1;
  iterator iVar2;
  
  iVar2 = FindLastLessOrEqual(this,name);
  if (((_Rb_tree_header *)iVar2._M_node != &(this->by_symbol_)._M_t._M_impl.super__Rb_tree_header)
     && (bVar1 = IsSubSymbol(this,(string *)(iVar2._M_node + 1),name), bVar1)) {
    return *(FileDescriptorProto **)(iVar2._M_node + 2);
  }
  return (FileDescriptorProto *)0x0;
}

Assistant:

Value SimpleDescriptorDatabase::DescriptorIndex<Value>::FindSymbol(
    const std::string& name) {
  typename std::map<std::string, Value>::iterator iter =
      FindLastLessOrEqual(name);

  return (iter != by_symbol_.end() && IsSubSymbol(iter->first, name))
             ? iter->second
             : Value();
}